

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  bool bVar1;
  size_type sVar2;
  reference ppVar3;
  mapped_type *pmVar4;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  double dVar5;
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  int *label;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  real gold;
  real score;
  pair<float,_int> *prediction;
  const_iterator __end1;
  const_iterator __begin1;
  Predictions *__range1;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffffa0;
  float *in_stack_ffffffffffffffa8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_28;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_20;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *local_18;
  Meter *local_8;
  
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = __x;
  this->nexamples_ = this->nexamples_ + 1;
  local_18 = in_RDX;
  local_8 = this;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  (this->metrics_).gold = sVar2 + (this->metrics_).gold;
  sVar2 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::size
                    (local_18);
  (this->metrics_).predicted = sVar2 + (this->metrics_).predicted;
  local_20 = local_18;
  local_28._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             *)this), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
             ::operator*(&local_28);
    pmVar4 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[](in_stack_ffffffffffffffa0,(key_type *)this);
    pmVar4->predicted = pmVar4->predicted + 1;
    dVar5 = std::exp((double)(ulong)(uint)ppVar3->first);
    auVar6 = ZEXT1664((undefined1  [16])0x0);
    bVar1 = utils::contains<int>
                      ((vector<int,_std::allocator<int>_> *)((long)dVar5 << 0x20),
                       in_stack_ffffffffffffffb8);
    if (bVar1) {
      pmVar4 = std::
               unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
               ::operator[](in_stack_ffffffffffffffa0,(key_type *)this);
      pmVar4->predictedGold = pmVar4->predictedGold + 1;
      (this->metrics_).predictedGold = (this->metrics_).predictedGold + 1;
      auVar6 = ZEXT464(0x3f800000);
    }
    std::
    unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
    ::operator[](in_stack_ffffffffffffffa0,(key_type *)this);
    std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
    emplace_back<float&,float&>
              ((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
               in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8,
               (float *)in_stack_ffffffffffffffa0);
    __gnu_cxx::
    __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator++(&local_28);
  }
  std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)this), bVar1) {
    in_stack_ffffffffffffffa0 =
         (unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
          *)__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                      &stack0xffffffffffffffb0);
    pmVar4 = std::
             unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
             ::operator[](in_stack_ffffffffffffffa0,(key_type *)this);
    pmVar4->gold = pmVar4->gold + 1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb0);
  }
  return auVar6._0_8_;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    real score = std::exp(prediction.first);
    real gold = 0.0;
    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
      gold = 1.0;
    }
    labelMetrics_[prediction.second].scoreVsTrue.emplace_back(score, gold);
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
  }
}